

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

Document * __thiscall svg::Document::operator<<(Document *this,Shape *shape)

{
  string local_38 [32];
  Shape *local_18;
  Shape *shape_local;
  Document *this_local;
  
  local_18 = shape;
  shape_local = (Shape *)this;
  (*(shape->super_Serializeable)._vptr_Serializeable[2])(local_38,shape,&this->layout);
  std::__cxx11::string::operator+=((string *)&this->body_nodes_str,local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

Document & operator<<(Shape const & shape)
        {
            body_nodes_str += shape.toString(layout);
            return *this;
        }